

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderIsValid(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlParserCtxtPtr pxVar2;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  if (reader->validate == XML_TEXTREADER_VALIDATE_XSD) {
    iVar1 = reader->xsdValidErrors;
  }
  else {
    if (reader->validate != XML_TEXTREADER_VALIDATE_RNG) {
      pxVar2 = reader->ctxt;
      if (pxVar2 == (xmlParserCtxtPtr)0x0) {
        return 0;
      }
      if (pxVar2->validate != 1) {
        return 0;
      }
      return pxVar2->valid;
    }
    iVar1 = reader->rngValidErrors;
  }
  return (uint)(iVar1 == 0);
}

Assistant:

int
xmlTextReaderIsValid(xmlTextReaderPtr reader)
{
    if (reader == NULL)
        return (-1);
#ifdef LIBXML_RELAXNG_ENABLED
    if (reader->validate == XML_TEXTREADER_VALIDATE_RNG)
        return (reader->rngValidErrors == 0);
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
    if (reader->validate == XML_TEXTREADER_VALIDATE_XSD)
        return (reader->xsdValidErrors == 0);
#endif
    if ((reader->ctxt != NULL) && (reader->ctxt->validate == 1))
        return (reader->ctxt->valid);
    return (0);
}